

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_subpasses2
          (Impl *this,Value *subpasses,VkSubpassDescription2 **out_subpasses)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  VkSubpassDescription2 *pVVar4;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar5;
  Type pGVar6;
  long lVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(subpasses);
  pVVar4 = ScratchAllocator::allocate_n_cleared<VkSubpassDescription2>
                     (&this->allocator,(ulong)SVar2);
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::Begin(subpasses);
  lVar7 = 0;
  while( true ) {
    pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::End(subpasses);
    if (this_00 == pGVar5) break;
    *(undefined4 *)((long)&pVVar4->sType + lVar7) = 0x3b9c73ca;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"flags");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar6);
    *(uint *)((long)&pVVar4->flags + lVar7) = uVar3;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"pipelineBindPoint");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar6);
    *(uint *)((long)&pVVar4->pipelineBindPoint + lVar7) = uVar3;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"viewMask");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar6);
    *(uint *)((long)&pVVar4->viewMask + lVar7) = uVar3;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"depthStencilAttachment");
    if (bVar1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"depthStencilAttachment");
      bVar1 = parse_attachment2(this,pGVar6,
                                (VkAttachmentReference2 **)
                                ((long)&pVVar4->pDepthStencilAttachment + lVar7));
      if (!bVar1) goto LAB_0014de2b;
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"resolveAttachments");
    if (bVar1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"resolveAttachments");
      bVar1 = parse_attachments2(this,pGVar6,
                                 (VkAttachmentReference2 **)
                                 ((long)&pVVar4->pResolveAttachments + lVar7));
      if (!bVar1) goto LAB_0014de2b;
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"inputAttachments");
    if (bVar1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"inputAttachments");
      SVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(pGVar6);
      *(SizeType *)((long)&pVVar4->inputAttachmentCount + lVar7) = SVar2;
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"inputAttachments");
      bVar1 = parse_attachments2(this,pGVar6,
                                 (VkAttachmentReference2 **)
                                 ((long)&pVVar4->pInputAttachments + lVar7));
      if (!bVar1) goto LAB_0014de2b;
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"colorAttachments");
    if (bVar1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"colorAttachments");
      SVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(pGVar6);
      *(SizeType *)((long)&pVVar4->colorAttachmentCount + lVar7) = SVar2;
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"colorAttachments");
      bVar1 = parse_attachments2(this,pGVar6,
                                 (VkAttachmentReference2 **)
                                 ((long)&pVVar4->pColorAttachments + lVar7));
      if (!bVar1) goto LAB_0014de2b;
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"preserveAttachments");
    if (bVar1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"preserveAttachments");
      SVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(pGVar6);
      *(SizeType *)((long)&pVVar4->preserveAttachmentCount + lVar7) = SVar2;
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"preserveAttachments");
      parse_uints(this,pGVar6,(uint32_t **)((long)&pVVar4->pPreserveAttachments + lVar7));
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"pNext");
    if (bVar1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"pNext");
      bVar1 = parse_pnext_chain(this,pGVar6,(void **)((long)&pVVar4->pNext + lVar7),
                                (StateCreatorInterface *)0x0,(DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar1) goto LAB_0014de2b;
    }
    this_00 = this_00 + 0x10;
    lVar7 = lVar7 + 0x58;
  }
  *out_subpasses = pVVar4;
LAB_0014de2b:
  return this_00 == pGVar5;
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_subpasses2(const Value &subpasses, const VkSubpassDescription2 **out_subpasses)
{
	auto *infos = allocator.allocate_n_cleared<VkSubpassDescription2>(subpasses.Size());
	auto *ret = infos;

	for (auto itr = subpasses.Begin(); itr != subpasses.End(); ++itr, infos++)
	{
		auto &obj = *itr;
		infos->sType = VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2;
		infos->flags = obj["flags"].GetUint();
		infos->pipelineBindPoint = static_cast<VkPipelineBindPoint>(obj["pipelineBindPoint"].GetUint());
		infos->viewMask = obj["viewMask"].GetUint();

		if (obj.HasMember("depthStencilAttachment"))
			if (!parse_attachment2(obj["depthStencilAttachment"], &infos->pDepthStencilAttachment))
				return false;

		if (obj.HasMember("resolveAttachments"))
			if (!parse_attachments2(obj["resolveAttachments"], &infos->pResolveAttachments))
				return false;

		if (obj.HasMember("inputAttachments"))
		{
			infos->inputAttachmentCount = obj["inputAttachments"].Size();
			if (!parse_attachments2(obj["inputAttachments"], &infos->pInputAttachments))
				return false;
		}

		if (obj.HasMember("colorAttachments"))
		{
			infos->colorAttachmentCount = obj["colorAttachments"].Size();
			if (!parse_attachments2(obj["colorAttachments"], &infos->pColorAttachments))
				return false;
		}

		if (obj.HasMember("preserveAttachments"))
		{
			infos->preserveAttachmentCount = obj["preserveAttachments"].Size();
			if (!parse_uints(obj["preserveAttachments"], &infos->pPreserveAttachments))
				return false;
		}

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &infos->pNext))
				return false;
	}

	*out_subpasses = ret;
	return true;
}